

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::DivideWrap(TPZMHMeshControl *this,TPZGeoEl *wrapelement)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl *pTVar4;
  int64_t iVar5;
  ostream *poVar6;
  long lVar7;
  TPZMHMeshControl *in_RSI;
  int is;
  TPZStack<TPZGeoEl_*,_10> subels;
  TPZAutoPointer<TPZRefPattern> siderefpattern_1;
  TPZAutoPointer<TPZRefPattern> elrefpattern;
  TPZAutoPointer<TPZRefPattern> siderefpattern;
  int isub;
  int nsidesdim;
  int nwrap;
  int nsub;
  TPZStack<TPZGeoElSide,_10> subelsides;
  TPZGeoElSide neighbour;
  int dim;
  TPZGeoElSide gelside;
  TPZGeoElSide *in_stack_fffffffffffffcd8;
  TPZGeoElSide *in_stack_fffffffffffffce0;
  TPZRefPattern *in_stack_fffffffffffffce8;
  TPZMHMeshControl *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  int local_234;
  TPZVec<TPZGeoEl_*> local_230 [2];
  TPZGeoElSide *in_stack_fffffffffffffe20;
  TPZMHMeshControl *in_stack_fffffffffffffe28;
  undefined1 local_1c0 [8];
  TPZAutoPointer local_1b8 [8];
  TPZAutoPointer<TPZRefPattern> local_1b0;
  undefined1 local_1a8 [8];
  TPZAutoPointer local_1a0 [12];
  int local_194;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  TPZVec<TPZGeoElSide> local_168 [8];
  TPZGeoElSide local_58;
  int local_2c;
  TPZGeoEl *in_stack_ffffffffffffffe8;
  TPZMHMeshControl *pTVar8;
  
  (*((TPZSavable *)&in_RSI->_vptr_TPZMHMeshControl)->_vptr_TPZSavable[0x1e])();
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)in_stack_fffffffffffffcf0,(TPZGeoEl *)in_stack_fffffffffffffce8,
             (int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_2c = TPZGeoElSide::Dimension(in_stack_fffffffffffffce0);
  TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffce8);
  while( true ) {
    iVar2 = TPZGeoElSide::operator!=(&local_58,(TPZGeoElSide *)&stack0xffffffffffffffd8);
    if (iVar2 == 0) goto LAB_01e18a28;
    pTVar4 = TPZGeoElSide::Element(&local_58);
    iVar2 = (**(code **)(*(long *)pTVar4 + 0x1d0))();
    if ((iVar2 != 0) && (iVar2 = TPZGeoElSide::NSubElements(in_stack_fffffffffffffcd8), 1 < iVar2))
    break;
    TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffce8);
    TPZGeoElSide::operator=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e18a23);
  }
  TPZStack<TPZGeoElSide,_10>::TPZStack((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffcf0);
  TPZGeoElSide::GetSubElements2
            (in_stack_fffffffffffffce0,(TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffcd8);
  iVar5 = TPZVec<TPZGeoElSide>::size(local_168);
  local_16c = (int)iVar5;
  local_170 = 0;
  local_174 = 0;
  for (local_178 = 0; local_178 < local_16c; local_178 = local_178 + 1) {
    TPZVec<TPZGeoElSide>::operator[](local_168,(long)local_178);
    iVar2 = TPZGeoElSide::Dimension(in_stack_fffffffffffffce0);
    if (iVar2 == local_2c) {
      local_174 = local_174 + 1;
      TPZVec<TPZGeoElSide>::operator[](local_168,(long)local_178);
      TPZGeoElSide::TPZGeoElSide(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd54 =
           HasWrapNeighbour(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e184f0);
      if (in_stack_fffffffffffffd54 != 0) {
        local_170 = local_170 + 1;
      }
    }
  }
  if ((local_170 != 0) && (local_170 != local_174)) {
    std::operator<<((ostream *)&std::cout,"I don\'t understand\n");
    pzinternal::DebugStopImpl
              ((char *)subels.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore,
               (size_t)subels.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.
                       _vptr_TPZVec);
  }
  if (local_170 == 0) {
    iVar2 = TPZGeoElSide::Side(&local_58);
    iVar3 = TPZGeoElSide::NSides
                      ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                      );
    if (iVar2 == iVar3 + -1) {
      pTVar4 = TPZGeoElSide::Element(&local_58);
      (**(code **)(*(long *)pTVar4 + 0x2b0))(local_1a0);
      bVar1 = ::TPZAutoPointer::operator_cast_to_bool(local_1a0);
      if (bVar1) {
        pTVar8 = in_RSI;
        TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0,
                   (TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffcd8);
        (*((TPZSavable *)&in_RSI->_vptr_TPZMHMeshControl)->_vptr_TPZSavable[0x55])(in_RSI,local_1a8)
        ;
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0);
        in_RSI = pTVar8;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "void TPZMHMeshControl::DivideWrap(TPZGeoEl *)");
        std::operator<<(poVar6," We expect elements to have refinement patterns\n");
      }
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0);
    }
    else {
      pTVar4 = TPZGeoElSide::Element(&local_58);
      (**(code **)(*(long *)pTVar4 + 0x2b0))(&local_1b0);
      bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&local_1b0);
      if (bVar1) {
        TPZAutoPointer<TPZRefPattern>::operator->(&local_1b0);
        TPZGeoElSide::Side(&local_58);
        TPZRefPattern::SideRefPattern
                  (in_stack_fffffffffffffce8,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
        bVar1 = ::TPZAutoPointer::operator_cast_to_bool(local_1b8);
        in_stack_fffffffffffffcf0 = in_RSI;
        if (!bVar1) {
          pzinternal::DebugStopImpl
                    ((char *)subels.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.
                             fStore,
                     (size_t)subels.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.
                             _vptr_TPZVec);
          in_stack_fffffffffffffcf0 = in_RSI;
        }
        in_RSI = in_stack_fffffffffffffcf0;
        TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0,
                   (TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffcd8);
        (*((TPZSavable *)&in_stack_fffffffffffffcf0->_vptr_TPZMHMeshControl)->_vptr_TPZSavable[0x55]
        )(in_stack_fffffffffffffcf0,local_1c0);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0);
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "void TPZMHMeshControl::DivideWrap(TPZGeoEl *)");
        std::operator<<(poVar6," We expect elements to have refinement patterns\n");
      }
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffce0);
    }
    TPZStack<TPZGeoEl_*,_10>::TPZStack((TPZStack<TPZGeoEl_*,_10> *)in_stack_fffffffffffffcf0);
    (*((TPZSavable *)&in_RSI->_vptr_TPZMHMeshControl)->_vptr_TPZSavable[0x38])(in_RSI,local_230);
    local_234 = 0;
    while( true ) {
      lVar7 = (long)local_234;
      iVar5 = TPZVec<TPZGeoEl_*>::size(local_230);
      if (iVar5 <= lVar7) break;
      TPZVec<TPZGeoEl_*>::operator[](local_230,(long)local_234);
      DivideWrap(in_RSI,in_stack_ffffffffffffffe8);
      local_234 = local_234 + 1;
    }
    local_194 = 3;
    TPZStack<TPZGeoEl_*,_10>::~TPZStack((TPZStack<TPZGeoEl_*,_10> *)0x1e189c0);
  }
  else {
    local_194 = 1;
  }
  TPZStack<TPZGeoElSide,_10>::~TPZStack((TPZStack<TPZGeoElSide,_10> *)0x1e189cd);
  if (local_194 == 3) {
LAB_01e18a28:
    local_194 = 0;
  }
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e18a40);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e18a4d);
  return;
}

Assistant:

void TPZMHMeshControl::DivideWrap(TPZGeoEl *wrapelement)
{
    TPZGeoElSide gelside(wrapelement, wrapelement->NSides()-1);
    int dim = gelside.Dimension();
    TPZGeoElSide neighbour = gelside.Neighbour();
    while (neighbour != gelside) {
        if(neighbour.Element()->HasSubElement() && neighbour.NSubElements() > 1)
        {
            // verify if the subelements are connected to a wrap element
            TPZStack<TPZGeoElSide> subelsides;
            neighbour.GetSubElements2(subelsides);
            int nsub = subelsides.size();
            int nwrap = 0;
            int nsidesdim = 0;
            for(int isub = 0; isub<nsub; isub++)
            {
                if(subelsides[isub].Dimension() == dim)
                {
                    nsidesdim++;
                }
                else continue;
                if(HasWrapNeighbour(subelsides[isub])) nwrap++;
            }
            if(nwrap != 0 && nwrap != nsidesdim)
            {
                std::cout << "I don't understand\n";
                DebugStop();
            }
            if(nwrap != 0) return;
            if (neighbour.Side() == neighbour.NSides()-1) {
                TPZAutoPointer<TPZRefPattern> siderefpattern = neighbour.Element()->GetRefPattern();
                if(!siderefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            else
            {
                TPZAutoPointer<TPZRefPattern> elrefpattern = neighbour.Element()->GetRefPattern();
                if(!elrefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    TPZAutoPointer<TPZRefPattern> siderefpattern = elrefpattern->SideRefPattern(neighbour.Side());
                    if(!siderefpattern) DebugStop();
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            TPZStack<TPZGeoEl *> subels;

            wrapelement->Divide(subels);
#ifdef PZDEBUG
            if(subels.size() == 1)
            {
                DebugStop();
            }
#endif
#ifdef PZ_LOG
            if(loggerWRAP.isDebugEnabled())
            {
                std::stringstream sout;
                sout << std::endl;
                for (int is=0; is<subels.size(); is++) {
                    sout << "Created a son wrap element of " << wrapelement->Index() <<
                    " matid " << wrapelement->MaterialId() << " with index " <<
                    subels[is]->Index() << std::endl;
                }
                LOGPZ_DEBUG(loggerWRAP, sout.str())
            }
#endif
            for (int is=0; is<subels.size(); is++) {
                DivideWrap(subels[is]);
            }
            break;
        }
        neighbour = neighbour.Neighbour();
    }
}